

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool_test.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  TimeAlloc timeCnt;
  ThreadPool threadPool;
  TimeAlloc local_160;
  code *local_158 [2];
  code *local_148;
  code *local_140;
  ThreadPool local_138;
  
  local_160.m_startTime = time((time_t *)0x0);
  ThreadPool::ThreadPool(&local_138,100);
  ThreadPool::Start(&local_138,2);
  iVar1 = 10000;
  do {
    local_158[1] = (code *)0x0;
    local_158[0] = SayHelloWorld;
    local_140 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
    local_148 = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
    ThreadPool::Run(&local_138,(CallFunc *)local_158);
    if (local_148 != (code *)0x0) {
      (*local_148)((_Any_data *)local_158,(_Any_data *)local_158,__destroy_functor);
    }
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  ThreadPool::~ThreadPool(&local_138);
  TimeAlloc::~TimeAlloc(&local_160);
  return 0;
}

Assistant:

int main()
{
	time_t startTime = time(NULL);
	TimeAlloc timeCnt(startTime);
	
	ThreadPool threadPool(100);
	threadPool.Start(2);
	for (int i = 0; i < 10000; ++i)
	{
		threadPool.Run(SayHelloWorld);
	}
}